

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O0

Violation mp::
          ComputeViolation<std::array<int,2ul>,std::array<int,0ul>,mp::LogicalFunctionalConstraintTraits,mp::EquivalenceId,mp::VarInfoImpl<std::vector<double,std::allocator<double>>>>
                    (CustomFunctionalConstraint<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::EquivalenceId>
                     *c,VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *x)

{
  Violation VVar1;
  bool bVar2;
  CtxVal CVar3;
  double *pdVar4;
  VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *in_RSI;
  VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *in_RDI;
  double dVar5;
  double dVar6;
  VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *this;
  double viol;
  int resvar;
  undefined8 in_stack_ffffffffffffff98;
  int iVar7;
  VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *in_stack_ffffffffffffffa0;
  double in_stack_ffffffffffffffb8;
  int i;
  Context local_34;
  double local_30;
  int local_24;
  VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *local_20;
  CustomFunctionalConstraint<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::EquivalenceId>
  *in_stack_fffffffffffffff0;
  double local_8;
  
  i = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  local_20 = in_RSI;
  local_24 = FunctionalConstraint::GetResultVar((FunctionalConstraint *)in_RDI);
  bVar2 = VarInfoImpl<std::vector<double,_std::allocator<double>_>_>::recomp_vals(local_20);
  iVar7 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  if (bVar2) {
    dVar5 = VarInfoImpl<std::vector<double,_std::allocator<double>_>_>::operator[]
                      (in_stack_ffffffffffffffa0,iVar7);
    iVar7 = (int)((ulong)dVar5 >> 0x20);
    dVar6 = VarInfoImpl<std::vector<double,_std::allocator<double>_>_>::raw
                      (in_stack_ffffffffffffffa0,iVar7);
    this = (VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *)ABS(dVar5 - dVar6);
    VarInfoImpl<std::vector<double,_std::allocator<double>_>_>::bounds_viol
              ((VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *)0x0,i);
    pdVar4 = std::max<double>((double *)&stack0xffffffffffffffc0,(double *)&stack0xffffffffffffffb8)
    ;
    dVar5 = (double)this + *pdVar4;
    local_8 = VarInfoImpl<std::vector<double,_std::allocator<double>_>_>::operator[](this,iVar7);
  }
  else {
    dVar5 = VarInfoImpl<std::vector<double,_std::allocator<double>_>_>::operator[]
                      (in_stack_ffffffffffffffa0,iVar7);
    local_30 = ComputeValue<mp::CustomFunctionalConstraint<std::array<int,2ul>,std::array<int,0ul>,mp::LogicalFunctionalConstraintTraits,mp::EquivalenceId>,mp::VarInfoImpl<std::vector<double,std::allocator<double>>>>
                         (in_stack_fffffffffffffff0,in_RDI);
    local_30 = dVar5 - local_30;
    local_34 = FunctionalConstraint::GetContext((FunctionalConstraint *)in_RDI);
    CVar3 = Context::GetValue(&local_34);
    if (CVar3 == CTX_POS) {
      local_8 = VarInfoImpl<std::vector<double,_std::allocator<double>_>_>::operator[]
                          (in_stack_ffffffffffffffa0,iVar7);
      dVar5 = local_30;
    }
    else if (CVar3 == CTX_NEG) {
      dVar5 = -local_30;
      local_8 = VarInfoImpl<std::vector<double,_std::allocator<double>_>_>::operator[]
                          (in_stack_ffffffffffffffa0,iVar7);
    }
    else if (CVar3 == CTX_MIX) {
      dVar5 = ABS(local_30);
      local_8 = VarInfoImpl<std::vector<double,_std::allocator<double>_>_>::operator[]
                          (in_stack_ffffffffffffffa0,iVar7);
    }
    else {
      local_8 = 0.0;
      dVar5 = INFINITY;
    }
  }
  VVar1.valX_ = local_8;
  VVar1.viol_ = dVar5;
  return VVar1;
}

Assistant:

Violation ComputeViolation(
    const CustomFunctionalConstraint<Args, Params, NumOrLogic, Id>& c,
    const VarVec& x) {
  auto resvar = c.GetResultVar();
  if (!x.recomp_vals()) {    // solver's var values: normal check
    auto viol = x[resvar] - ComputeValue(c, x);
    switch (c.GetContext().GetValue()) {
    case Context::CTX_MIX:
      return {std::fabs(viol), x[resvar]};
    case Context::CTX_POS:
      return {viol, x[resvar]};
    case Context::CTX_NEG:
      return {-viol, x[resvar]};
    default:
      return {INFINITY, 0.0};
    }
  }
  return                              // recomputed var minus solver's
  { std::fabs(x[resvar] - x.raw(resvar))
        + std::max(0.0, x.bounds_viol(resvar)), x[resvar]};
}